

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_LoadThings2(MapData *map)

{
  double *pdVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  FMapThing *pFVar4;
  WORD WVar5;
  DWORD DVar6;
  uint amount;
  FMapThing *pFVar7;
  void *buffer;
  FDoomEdEntry *pFVar8;
  long lVar9;
  int local_38;
  int local_34;
  int j;
  int i;
  mapthinghexen_t *mth;
  FMapThing *mti;
  char *mtp;
  int numthings;
  int lumplen;
  MapData *map_local;
  
  DVar6 = MapData::Size(map,1);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(int)DVar6;
  amount = SUB164(auVar3 / ZEXT816(0x14),0);
  TArray<FMapThing,_FMapThing>::Resize(&MapThingsConverted,amount);
  pFVar7 = TArray<FMapThing,_FMapThing>::operator[](&MapThingsConverted,0);
  buffer = operator_new__((long)(int)DVar6);
  MapData::Read(map,1,buffer,-1);
  for (local_34 = 0; local_34 < (int)amount; local_34 = local_34 + 1) {
    lVar9 = (long)local_34;
    pFVar4 = pFVar7 + lVar9;
    pFVar4->pitch = 0;
    pFVar4->roll = 0;
    pFVar4->RenderStyle = 0;
    *(undefined8 *)(&pFVar4->pitch + 4) = 0;
    pdVar1 = &pFVar7[lVar9].Scale.Y;
    *pdVar1 = 0.0;
    pdVar1[1] = 0.0;
    *(undefined8 *)&pFVar7[lVar9].fillcolor = 0;
    ((DVector2 *)(&pFVar7[lVar9].fillcolor + 2))->X = 0.0;
    pFVar7[lVar9].Gravity = 0.0;
    (&pFVar7[lVar9].Gravity)[1] = 0.0;
    piVar2 = pFVar7[lVar9].args + 2;
    piVar2[0] = 0;
    piVar2[1] = 0;
    *(undefined8 *)(piVar2 + 2) = 0;
    pFVar4 = pFVar7 + lVar9;
    pFVar4->flags = 0;
    pFVar4->special = 0;
    (&pFVar4->flags + 2)[0] = 0;
    (&pFVar4->flags + 2)[1] = 0;
    pFVar4 = pFVar7 + lVar9;
    pFVar4->angle = 0;
    pFVar4->SkillFilter = 0;
    pFVar4->ClassFilter = 0;
    pFVar4->EdNum = 0;
    *(FDoomEdEntry **)(&pFVar4->angle + 4) = (FDoomEdEntry *)0x0;
    pdVar1 = &pFVar7[lVar9].pos.Y;
    *pdVar1 = 0.0;
    pdVar1[1] = 0.0;
    *(undefined8 *)(pFVar7 + lVar9) = 0;
    pFVar7[lVar9].pos.X = 0.0;
    pFVar7[local_34].thingid = (int)*(short *)((long)buffer + (long)local_34 * 0x14);
    pFVar7[local_34].pos.X = (double)(int)*(short *)((long)buffer + (long)local_34 * 0x14 + 2);
    pFVar7[local_34].pos.Y = (double)(int)*(short *)((long)buffer + (long)local_34 * 0x14 + 4);
    pFVar7[local_34].pos.Z = (double)(int)*(short *)((long)buffer + (long)local_34 * 0x14 + 6);
    pFVar7[local_34].angle = *(short *)((long)buffer + (long)local_34 * 0x14 + 8);
    pFVar7[local_34].EdNum = *(short *)((long)buffer + (long)local_34 * 0x14 + 10);
    pFVar8 = TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::CheckKey
                       (&DoomEdMap,(int)pFVar7[local_34].EdNum);
    pFVar7[local_34].info = pFVar8;
    pFVar7[local_34].flags = (uint)*(ushort *)((long)buffer + (long)local_34 * 0x14 + 0xc);
    pFVar7[local_34].special = (uint)*(byte *)((long)buffer + (long)local_34 * 0x14 + 0xe);
    for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
      pFVar7[local_34].args[local_38] =
           (uint)*(byte *)((long)buffer + (long)local_38 + (long)local_34 * 0x14 + 0xf);
    }
    WVar5 = MakeSkill(pFVar7[local_34].flags);
    pFVar7[local_34].SkillFilter = WVar5;
    pFVar7[local_34].ClassFilter = (WORD)((pFVar7[local_34].flags & 0xe0) >> 5);
    pFVar7[local_34].flags = pFVar7[local_34].flags & 0xffffff18;
    if ((level.flags2 & 0x800000) != 0) {
      pFVar7[local_34].flags = pFVar7[local_34].flags & 0x7ff;
    }
    pFVar7[local_34].Gravity = 1.0;
    pFVar7[local_34].RenderStyle = 0xe;
    pFVar7[local_34].Alpha = -1.0;
    pFVar7[local_34].health = 1;
    pFVar7[local_34].FloatbobPhase = -1;
  }
  if (buffer != (void *)0x0) {
    operator_delete__(buffer);
  }
  return;
}

Assistant:

void P_LoadThings2 (MapData * map)
{
	int	lumplen = map->Size(ML_THINGS);
	int numthings = lumplen / sizeof(mapthinghexen_t);

	char *mtp;

	MapThingsConverted.Resize(numthings);
	FMapThing *mti = &MapThingsConverted[0];

	mtp = new char[lumplen];
	map->Read(ML_THINGS, mtp);
	mapthinghexen_t *mth = (mapthinghexen_t*)mtp;

	for(int i = 0; i< numthings; i++)
	{
		memset (&mti[i], 0, sizeof(mti[i]));

		mti[i].thingid = LittleShort(mth[i].thingid);
		mti[i].pos.X = LittleShort(mth[i].x);
		mti[i].pos.Y = LittleShort(mth[i].y);
		mti[i].pos.Z = LittleShort(mth[i].z);
		mti[i].angle = LittleShort(mth[i].angle);
		mti[i].EdNum = LittleShort(mth[i].type);
		mti[i].info = DoomEdMap.CheckKey(mti[i].EdNum);
		mti[i].flags = LittleShort(mth[i].flags);
		mti[i].special = mth[i].special;
		for(int j=0;j<5;j++) mti[i].args[j] = mth[i].args[j];
		mti[i].SkillFilter = MakeSkill(mti[i].flags);
		mti[i].ClassFilter = (mti[i].flags & MTF_CLASS_MASK) >> MTF_CLASS_SHIFT;
		mti[i].flags &= ~(MTF_SKILLMASK|MTF_CLASS_MASK);
		if (level.flags2 & LEVEL2_HEXENHACK)
		{
			mti[i].flags &= 0x7ff;	// mask out Strife flags if playing an original Hexen map.
		}

		mti[i].Gravity = 1;
		mti[i].RenderStyle = STYLE_Count;
		mti[i].Alpha = -1;
		mti[i].health = 1;
		mti[i].FloatbobPhase = -1;
	}
	delete[] mtp;
}